

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

void __thiscall IR::IndirOpnd::~IndirOpnd(IndirOpnd *this)

{
  RegOpnd *pRVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  undefined4 *puVar5;
  
  (this->super_Opnd)._vptr_Opnd = (_func_int **)&PTR_DummyFunction_014d8608;
  pRVar1 = this->m_baseOpnd;
  if (pRVar1 != (RegOpnd *)0x0) {
    bVar4 = (pRVar1->super_Opnd).field_0xb;
    if ((bVar4 & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x2a,"(m_inUse)","Expected inUse to be set...");
      if (!bVar3) goto LAB_006190a4;
      *puVar5 = 0;
      bVar4 = (pRVar1->super_Opnd).field_0xb;
    }
    (pRVar1->super_Opnd).field_0xb = bVar4 & 0xfd;
    Opnd::Free(&this->m_baseOpnd->super_Opnd,this->m_func);
  }
  pRVar1 = this->m_indexOpnd;
  if (pRVar1 != (RegOpnd *)0x0) {
    bVar4 = (pRVar1->super_Opnd).field_0xb;
    if ((bVar4 & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x2a,"(m_inUse)","Expected inUse to be set...");
      if (!bVar3) {
LAB_006190a4:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
      bVar4 = (pRVar1->super_Opnd).field_0xb;
    }
    (pRVar1->super_Opnd).field_0xb = bVar4 & 0xfd;
    Opnd::Free(&this->m_indexOpnd->super_Opnd,this->m_func);
  }
  return;
}

Assistant:

IndirOpnd::~IndirOpnd()
{
    if (m_baseOpnd != nullptr)
    {
        m_baseOpnd->UnUse();
        m_baseOpnd->Free(m_func);
    }
    if (m_indexOpnd != nullptr)
    {
        m_indexOpnd->UnUse();
        m_indexOpnd->Free(m_func);
    }
}